

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::report_missed
          (call_matcher<void_(),_std::tuple<>_> *this,char *reason)

{
  char *name;
  sequence_handler_base *psVar1;
  string local_38;
  
  this->reported = true;
  name = (this->super_call_matcher_base<void_()>).name;
  params_string<>(&local_38,(tuple<> *)&this->field_0x78);
  psVar1 = (this->sequences)._M_t.
           super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
           .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
  report_unfulfilled(reason,name,&local_38,psVar1->min_calls,psVar1->call_count,
                     (this->super_call_matcher_base<void_()>).loc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
    report_missed(
      char const *reason)
    noexcept
    {
      reported = true;
      report_unfulfilled(
        reason,
        name,
        params_string(val),
        sequences->get_min_calls(),
        sequences->get_calls(),
        loc);
    }